

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.h
# Opt level: O3

ZyanStatus
ZydisStringAppendDecS
          (ZyanString *string,ZyanI64 value,ZyanU8 padding_length,ZyanBool force_sign,
          ZyanStringView *prefix,ZyanStringView *suffix)

{
  ZyanUSize ZVar1;
  void *pvVar2;
  ZyanUSize ZVar3;
  ZyanStatus ZVar4;
  
  if (value < 0) {
    if (string == (ZyanString *)0x0) {
LAB_0011e701:
      __assert_fail("destination && source",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                    ,0xea,
                    "ZyanStatus ZydisStringAppendShort(ZyanString *, const ZydisShortString *)");
    }
    if ((string->vector).allocator != (ZyanAllocator *)0x0) {
LAB_0011e720:
      __assert_fail("!destination->vector.allocator",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                    ,0xeb,
                    "ZyanStatus ZydisStringAppendShort(ZyanString *, const ZydisShortString *)");
    }
    ZVar1 = (string->vector).size;
    if (ZVar1 == 0) {
LAB_0011e73f:
      __assert_fail("destination->vector.size && source->size",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                    ,0xec,
                    "ZyanStatus ZydisStringAppendShort(ZyanString *, const ZydisShortString *)");
    }
    if ((string->vector).capacity < ZVar1 + 1) {
      return 0x80100009;
    }
    *(undefined2 *)((long)(string->vector).data + (ZVar1 - 1)) = 0x2d;
    ZVar1 = (string->vector).size;
    pvVar2 = (string->vector).data;
    (string->vector).size = ZVar1 + 1;
    if (*(char *)((long)pvVar2 + ZVar1) != '\0') {
LAB_0011e75e:
      __assert_fail("*(char*)((ZyanU8*)(destination)->vector.data + (destination)->vector.size - 1) == \'\\0\'"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                    ,0xf7,
                    "ZyanStatus ZydisStringAppendShort(ZyanString *, const ZydisShortString *)");
    }
    if (prefix != (ZyanStringView *)0x0) {
      if ((string->vector).allocator != (ZyanAllocator *)0x0) {
        __assert_fail("!destination->vector.allocator",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                      ,0x87,"ZyanStatus ZydisStringAppend(ZyanString *, const ZyanStringView *)");
      }
      if ((ZVar1 + 1 == 0) || (ZVar3 = (prefix->string).vector.size, ZVar3 == 0)) {
        __assert_fail("destination->vector.size && source->string.vector.size",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                      ,0x88,"ZyanStatus ZydisStringAppend(ZyanString *, const ZyanStringView *)");
      }
      if ((string->vector).capacity < ZVar1 + ZVar3) {
        return 0x80100009;
      }
      memcpy((void *)((long)pvVar2 + ZVar1),(prefix->string).vector.data,ZVar3 - 1);
      ZVar1 = (prefix->string).vector.size;
      ZVar3 = (string->vector).size;
      (string->vector).size = (ZVar1 + ZVar3) - 1;
      *(undefined1 *)((long)(string->vector).data + ZVar1 + ZVar3 + -2) = 0;
    }
    value = -value;
    prefix = (ZyanStringView *)0x0;
  }
  else if (force_sign != '\0') {
    if (string == (ZyanString *)0x0) goto LAB_0011e701;
    if ((string->vector).allocator != (ZyanAllocator *)0x0) goto LAB_0011e720;
    ZVar1 = (string->vector).size;
    if (ZVar1 == 0) goto LAB_0011e73f;
    if ((string->vector).capacity < ZVar1 + 1) {
      return 0x80100009;
    }
    *(undefined2 *)((long)(string->vector).data + (ZVar1 - 1)) = 0x2b;
    ZVar1 = (string->vector).size;
    (string->vector).size = ZVar1 + 1;
    if (*(char *)((long)(string->vector).data + ZVar1) != '\0') goto LAB_0011e75e;
  }
  ZVar4 = ZydisStringAppendDecU(string,value,padding_length,prefix,suffix);
  return ZVar4;
}

Assistant:

ZYAN_INLINE ZyanStatus ZydisStringAppendDecS(ZyanString* string, ZyanI64 value,
    ZyanU8 padding_length, ZyanBool force_sign, const ZyanStringView* prefix,
    const ZyanStringView* suffix)
{
    static const ZydisShortString str_add = ZYDIS_MAKE_SHORTSTRING("+");
    static const ZydisShortString str_sub = ZYDIS_MAKE_SHORTSTRING("-");

    if (value < 0)
    {
        ZYAN_CHECK(ZydisStringAppendShort(string, &str_sub));
        if (prefix)
        {
            ZYAN_CHECK(ZydisStringAppend(string, prefix));
        }
        return ZydisStringAppendDecU(string, ZyanAbsI64(value), padding_length,
            (const ZyanStringView*)ZYAN_NULL, suffix);
    }

    if (force_sign)
    {
        ZYAN_ASSERT(value >= 0);
        ZYAN_CHECK(ZydisStringAppendShort(string, &str_add));
    }
    return ZydisStringAppendDecU(string, value, padding_length, prefix, suffix);
}